

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O2

void NOPN2_Clock(ym3438_t *chip,Bit32s *buffer)

{
  ulong uVar1;
  uint uVar22;
  byte bVar2;
  byte bVar3;
  Bit8u BVar4;
  short sVar5;
  ushort uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  Bit8u *pBVar10;
  byte bVar11;
  short sVar12;
  Bit16u BVar13;
  ulong uVar14;
  byte bVar15;
  byte bVar16;
  uint uVar17;
  ushort uVar18;
  ushort uVar19;
  byte bVar20;
  char cVar21;
  uint uVar23;
  ulong uVar24;
  Bit8u BVar25;
  ulong uVar26;
  byte bVar27;
  short sVar28;
  Bit32s BVar29;
  byte bVar30;
  uint uVar31;
  ulong uVar32;
  bool bVar33;
  bool bVar34;
  ushort local_44;
  
  uVar17 = chip->cycles;
  uVar26 = (ulong)uVar17;
  chip->pg_read = chip->pg_read >> 1;
  chip->eg_read[1] = chip->eg_read[1] >> 1;
  bVar11 = chip->eg_cycle + 1;
  bVar3 = chip->mode_test_21[1];
  chip->lfo_inc = bVar3;
  chip->eg_cycle = bVar11;
  if (uVar26 == 1) {
    if (chip->eg_quotient == 2) {
      if (chip->eg_cycle_stop == '\0') {
        BVar4 = chip->eg_shift + '\x01';
      }
      else {
        BVar4 = '\0';
      }
      chip->eg_shift_lock = BVar4;
      uVar18 = chip->eg_timer;
      chip->eg_timer_low_lock = (byte)uVar18 & 3;
    }
    else {
      uVar18 = chip->eg_timer;
    }
    bVar11 = 0;
    uVar22 = (uint)(ushort)(chip->eg_quotient + 1) % 3;
    chip->eg_quotient = (Bit16u)uVar22;
    chip->eg_cycle = '\0';
    chip->eg_cycle_stop = '\x01';
    chip->eg_shift = '\0';
    uVar22 = (uint)uVar18 + ((uint)chip->eg_timer_inc | uVar22 >> 1);
    chip->eg_timer_inc = (Bit8u)((uVar22 & 0xffff) >> 0xc);
    chip->eg_timer = (ushort)uVar22 & 0xfff;
  }
  else if (uVar26 == 0x17) {
    bVar3 = bVar3 | 1;
    chip->lfo_inc = bVar3;
  }
  else if (uVar17 == 2) {
    chip->pg_read = chip->pg_phase[0x15] & 0x3ff;
    chip->eg_read[1] = (uint)chip->eg_out[0];
  }
  else if (uVar17 == 0xd) {
    chip->eg_cycle = '\0';
    chip->eg_cycle_stop = '\x01';
    chip->eg_shift = '\0';
    uVar18 = (ushort)chip->eg_timer_inc + chip->eg_timer;
    chip->eg_timer_inc = (byte)(uVar18 >> 0xc);
    chip->eg_timer = uVar18 & 0xfff;
    bVar11 = 0;
  }
  else if (uVar17 == 0) {
    bVar15 = chip->lfo_cnt;
    chip->lfo_pm = bVar15 >> 2;
    bVar20 = bVar15 & 0x3f;
    if ((bVar15 & 0x40) == 0) {
      bVar20 = bVar15 ^ 0x3f;
    }
    chip->lfo_am = bVar20 * '\x02';
  }
  uVar7 = ~((uint)chip->mode_test_21[5] << (bVar11 & 0x1f)) & (uint)chip->eg_timer;
  chip->eg_timer = (Bit16u)uVar7;
  uVar22._0_1_ = chip->eg_custom_timer;
  uVar22._1_1_ = chip->eg_rate;
  uVar22._2_1_ = chip->eg_ksv;
  uVar22._3_1_ = chip->eg_inc;
  if (((chip->pin_test_in & uVar22 | uVar7 >> (bVar11 & 0x1f)) & (uint)chip->eg_cycle_stop) != 0) {
    chip->eg_shift = bVar11;
    chip->eg_cycle_stop = '\0';
  }
  bVar15 = chip->write_a & 3;
  chip->write_a_en = bVar15 == 1;
  bVar20 = chip->write_d & 3;
  bVar33 = bVar20 == 1;
  chip->write_d_en = bVar33;
  chip->write_a = chip->write_a * '\x02';
  chip->write_d = chip->write_d * '\x02';
  BVar4 = chip->write_busy;
  chip->busy = BVar4;
  bVar11 = chip->write_busy_cnt + BVar4;
  bVar34 = bVar11 < 0x20 || bVar33;
  if (BVar4 == '\0') {
    bVar34 = bVar33;
  }
  chip->write_busy = bVar34;
  chip->write_busy_cnt = bVar11 & 0x1f;
  bVar11 = chip->timer_a_overflow;
  bVar16 = bVar11;
  if (uVar17 == 2) {
    bVar16 = (chip->timer_a_load != '\0' && chip->timer_a_load_lock == '\0') | bVar11;
    chip->timer_a_load_lock = chip->timer_a_load;
    bVar2 = bVar16;
    if (chip->mode_csm == '\0') {
      bVar2 = 0;
    }
    chip->mode_kon_csm = bVar2;
  }
  uVar18 = chip->ch_out[(ulong)(chip->timer_a_load_latch != '\0') + 9];
  chip->timer_a_load_latch = bVar16;
  if (((uVar17 == 1) && (chip->timer_a_load_lock != '\0')) || (chip->mode_test_21[2] != '\0')) {
    uVar18 = uVar18 + 1;
  }
  if (chip->timer_a_reset == '\0') {
    chip->timer_a_overflow_flag = chip->timer_a_overflow_flag | bVar11 & chip->timer_a_enable;
  }
  else {
    chip->timer_a_reset = '\0';
    chip->timer_a_overflow_flag = '\0';
  }
  chip->timer_a_overflow = (byte)(uVar18 >> 10);
  chip->timer_a_cnt = uVar18 & 0x3ff;
  bVar11 = chip->timer_b_overflow;
  bVar16 = bVar11;
  if (uVar17 == 2) {
    bVar16 = (chip->timer_b_load != '\0' && chip->timer_b_load_lock == '\0') | bVar11;
    chip->timer_b_load_lock = chip->timer_b_load;
  }
  uVar18 = *(ushort *)(chip->mode_test_21 + (ulong)(chip->timer_b_load_latch != '\0') * 4 + -0xd);
  chip->timer_b_load_latch = bVar16;
  bVar16 = (uVar17 == 1) + chip->timer_b_subcnt;
  if (((bVar16 == 0x10) && (chip->timer_b_load_lock != '\0')) || (chip->mode_test_21[2] != '\0')) {
    uVar18 = uVar18 + 1;
  }
  chip->timer_b_subcnt = bVar16 & 0xf;
  if (chip->timer_b_reset == '\0') {
    chip->timer_b_overflow_flag = chip->timer_b_overflow_flag | bVar11 & chip->timer_b_enable;
  }
  else {
    chip->timer_b_reset = '\0';
    chip->timer_b_overflow_flag = '\0';
  }
  chip->timer_b_overflow = (Bit8u)(uVar18 >> 8);
  chip->timer_b_cnt = uVar18 & 0xff;
  uVar22 = chip->channel;
  uVar32 = (ulong)uVar22;
  chip->eg_kon_latch[uVar26] = chip->mode_kon[uVar26];
  chip->eg_kon_csm[uVar26] = '\0';
  if ((uVar32 == 2) && (chip->mode_kon_csm != '\0')) {
    chip->eg_kon_latch[uVar26] = '\x01';
    chip->eg_kon_csm[uVar26] = '\x01';
  }
  if (uVar17 == chip->mode_kon_channel) {
    chip->mode_kon[uVar32] = chip->mode_kon_operator[0];
    chip->mode_kon[uVar22 + 0xc] = chip->mode_kon_operator[1];
    chip->mode_kon[uVar22 + 6] = chip->mode_kon_operator[2];
    chip->mode_kon[uVar22 + 0x12] = chip->mode_kon_operator[3];
  }
  bVar11 = chip->mode_test_2c[5];
  uVar6 = (ushort)bVar11;
  uVar18 = chip->ch_lock;
  chip->ch_read = uVar18;
  uVar23 = uVar22 + (uVar17 < 0xc);
  uVar7 = uVar17 & 3;
  if (uVar7 == 0) {
    if (bVar11 == 0) {
      uVar18 = chip->ch_out[uVar23];
      chip->ch_lock = uVar18;
    }
    chip->ch_lock_l = chip->pan_l[uVar23];
    chip->ch_lock_r = chip->pan_r[uVar23];
  }
  if ((uVar17 & 0xfffffffc) == 4) {
    if (chip->dacen != '\0' || bVar11 != 0) {
LAB_00132c4b:
      uVar18 = (chip->dacdata & 0xffU) - (chip->dacdata & 0x100U);
    }
  }
  else if (bVar11 != 0) goto LAB_00132c4b;
  chip->mol = 0;
  chip->mor = 0;
  if ((chip->chip_type & 1) == 0) {
    BVar29 = 0;
    if (chip->ch_lock_l == '\0') {
      local_44 = 0;
    }
    else {
      local_44 = 0;
      if (uVar7 != 0 || bVar11 != 0) {
        chip->mol = uVar18;
        local_44 = uVar18;
      }
    }
    if (chip->ch_lock_r != '\0' && (uVar7 != 0 || bVar11 != 0)) goto LAB_00132d00;
  }
  else {
    sVar5 = uVar18 + -((short)~uVar18 >> 0xf);
    sVar28 = -((short)~uVar18 >> 0xf) + (short)(char)(uVar18 >> 8);
    sVar12 = sVar28;
    if (bVar11 != 0) {
      sVar12 = sVar5;
    }
    if (uVar7 == 3) {
      sVar12 = sVar5;
    }
    sVar5 = sVar28;
    if (chip->ch_lock_l != '\0') {
      sVar5 = sVar12;
    }
    if (chip->ch_lock_r == '\0') {
      sVar12 = sVar28;
    }
    local_44 = sVar5 * 3;
    chip->mol = local_44;
    uVar18 = sVar12 * 3;
LAB_00132d00:
    chip->mor = uVar18;
    BVar29 = (Bit32s)(short)uVar18;
  }
  uVar24 = (ulong)(uVar17 + 0x12) % 0x18;
  uVar7 = (uint)uVar24;
  if (*(int *)((ulong)(byte)((ushort)uVar24 / 6) * 0xc0 + 0x162820 +
              (ulong)chip->connect[uVar32] * 4) != 0 && bVar11 == 0) {
    uVar6 = (ushort)((uint)(int)chip->fm_out[uVar24] >> 5);
  }
  sVar12 = chip->ch_acc[uVar32];
  if (uVar7 < 6 || bVar11 != 0) {
    chip->ch_out[uVar32] = sVar12;
  }
  uVar18 = 0;
  sVar5 = 0;
  if (bVar11 != 0) {
    sVar5 = sVar12;
  }
  if (5 < uVar7) {
    sVar5 = sVar12;
  }
  sVar12 = -0x100;
  if (-0x100 < (short)(uVar6 + sVar5)) {
    sVar12 = uVar6 + sVar5;
  }
  sVar5 = 0xff;
  if (sVar12 < 0xff) {
    sVar5 = sVar12;
  }
  chip->ch_acc[uVar32] = sVar5;
  uVar1 = (ulong)(uVar17 + 6) % 0x18;
  uVar14 = (ulong)chip->connect[uVar32];
  uVar8 = (ulong)(byte)((ushort)uVar1 / 6);
  lVar9 = uVar8 * 0xc0;
  if (fm_algorithm[uVar8][0][uVar14] != 0) {
    uVar18 = chip->fm_op1[uVar32][0];
  }
  if (*(int *)(lVar9 + 0x1627a0 + uVar14 * 4) == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = chip->fm_op1[uVar32][1];
  }
  if (*(int *)(lVar9 + 0x1627c0 + uVar14 * 4) != 0) {
    uVar6 = uVar6 | chip->fm_op2[uVar32];
  }
  if (*(int *)(lVar9 + 0x1627e0 + uVar14 * 4) != 0) {
    uVar18 = uVar18 | chip->fm_out[uVar24];
  }
  if (*(int *)(lVar9 + 0x162800 + uVar14 * 4) != 0) {
    uVar6 = uVar6 | chip->fm_out[uVar24];
  }
  if ((uint)uVar1 < 6) {
    BVar13 = 0;
    if (chip->fb[uVar32] != '\0') {
      BVar13 = (Bit16u)((int)(short)(uVar6 + uVar18) >> (10 - chip->fb[uVar32] & 0x1f));
    }
  }
  else {
    BVar13 = (Bit16u)((uint)(int)(short)(uVar6 + uVar18) >> 1);
  }
  chip->fm_mod[uVar1] = BVar13;
  if (uVar7 < 6) {
    chip->fm_op1[uVar32][1] = chip->fm_op1[uVar32][0];
    chip->fm_op1[uVar32][0] = chip->fm_out[uVar24];
  }
  else if (uVar7 - 0xc < 6) {
    chip->fm_op2[uVar32] = chip->fm_out[uVar24];
  }
  uVar24 = (ulong)(uVar17 + 0x13) % 0x18;
  uVar7 = chip->pg_phase[uVar24];
  uVar18 = (short)(uVar7 >> 10) + chip->fm_mod[uVar24];
  uVar23 = ~(uint)uVar18;
  if ((uVar18 & 0x100) == 0) {
    uVar23 = (uint)uVar18;
  }
  uVar19 = chip->eg_out[uVar24] * 4 + logsinrom[uVar23 & 0xff];
  uVar6 = 0x1fff;
  if (uVar19 < 0x1fff) {
    uVar6 = uVar19;
  }
  uVar19 = (ushort)chip->mode_test_21[4] << 0xd ^
           (ushort)(((uint)exprom[~(uint)uVar6 & 0xff] << 2 | 0x1000) >> ((byte)(uVar6 >> 8) & 0x1f)
                   );
  uVar6 = -uVar19;
  if ((uVar18 & 0x200) == 0) {
    uVar6 = uVar19;
  }
  chip->fm_out[uVar24] = (uVar6 & 0x1fff) - (uVar6 & 0x2000);
  uVar1 = (ulong)(uVar17 + 0x14) % 0x18;
  if (chip->pg_reset[uVar1] != '\0') {
    chip->pg_inc[uVar1] = 0;
  }
  uVar23 = 0;
  if ((chip->pg_reset[uVar24] == '\0') && (uVar23 = 0, chip->mode_test_21[3] == '\0')) {
    uVar23 = uVar7;
  }
  chip->pg_phase[uVar24] = uVar23 + chip->pg_inc[uVar24] & 0xfffff;
  bVar2 = chip->lfo_pm & 0xf;
  bVar11 = chip->pms[uVar32];
  bVar16 = bVar2 ^ 0xf;
  if (bVar2 < 8) {
    bVar16 = bVar2;
  }
  bVar2 = chip->dt[uVar26];
  uVar7 = 0;
  bVar30 = bVar2 & 3;
  if (bVar30 != 0) {
    bVar27 = 0x1c;
    if (chip->pg_kcode < 0x1c) {
      bVar27 = chip->pg_kcode;
    }
    uVar7 = pg_detune[((bVar30 == 3) + (bVar27 >> 2)) * '\x04' + 0x24 & 4 | bVar27 & 3] >>
            (9 - ((byte)((bVar2 & 2 | bVar30 == 3) + (bVar27 >> 2) + 9) >> 1) & 0x1f) & 0xff;
  }
  uVar18 = chip->pg_fnum >> 4;
  bVar30 = bVar11 - 5;
  if (bVar11 < 6) {
    bVar30 = 0;
  }
  uVar31 = ((uint)(uVar18 >> ((byte)pg_lfo_sh2[bVar11][bVar16] & 0x1f)) +
            (uint)(uVar18 >> ((byte)pg_lfo_sh1[bVar11][bVar16] & 0x1f)) << (bVar30 & 0x1f)) >> 2;
  uVar23 = -uVar31;
  if ((chip->lfo_pm & 0x10) == 0) {
    uVar23 = uVar31;
  }
  uVar31 = -uVar7;
  if ((bVar2 & 4) == 0) {
    uVar31 = uVar7;
  }
  chip->pg_inc[uVar26] =
       (uint)chip->multi[uVar26] *
       (uVar31 + (((uVar23 + (uint)chip->pg_fnum * 2 & 0xfff) << (chip->pg_block & 0x1f)) >> 2) &
       0x1ffff) >> 1 & 0xfffff;
  uVar24 = (ulong)(uVar17 + 0x16) % 0x18;
  BVar4 = chip->eg_kon_latch[uVar24];
  bVar11 = chip->eg_state[uVar24];
  BVar25 = chip->eg_kon[uVar24];
  chip->eg_read[0] = (uint)chip->eg_read_inc;
  bVar16 = chip->eg_inc;
  chip->eg_read_inc = bVar16 != 0;
  if (BVar25 == '\0' && BVar4 != '\0') {
    chip->pg_reset[uVar24] = '\x01';
    bVar34 = false;
  }
  else {
    chip->pg_reset[uVar24] = chip->eg_ssg_pgrst_latch[uVar24] != '\0';
    if (BVar25 == '\0') {
      bVar34 = true;
    }
    else {
      bVar34 = chip->eg_ssg_repeat_latch[uVar24] == '\0';
    }
  }
  uVar18 = chip->eg_level[uVar24];
  uVar6 = 0x200 - uVar18 & 0x3ff;
  if (chip->eg_ssg_inv[uVar24] == '\0') {
    uVar6 = uVar18;
  }
  if (BVar25 == '\0') {
    uVar6 = uVar18;
  }
  if (BVar4 != '\0') {
    uVar6 = uVar18;
  }
  BVar25 = chip->eg_ssg_enable[uVar24];
  cVar21 = (~uVar6 & 0x3f0) == 0;
  if (BVar25 != '\0') {
    cVar21 = (char)((int)(short)uVar6 >> 9);
  }
  if (bVar34) {
    bVar30 = bVar11;
    if (bVar11 - 2 < 2) {
      if (bVar16 == 0 || cVar21 != '\0') goto LAB_00133357;
      bVar2 = bVar11;
      if (BVar25 == '\0') {
LAB_00133b25:
        bVar2 = bVar30;
        sVar12 = (short)(1 << (bVar16 - 1 & 0x1f));
      }
      else {
LAB_00133328:
        sVar12 = (short)(4 << (bVar16 - 1 & 0x1f));
      }
    }
    else {
      if (bVar11 == 1) {
        if ((uint)chip->eg_sl[1] * 2 == (int)(short)uVar6 >> 4) {
          bVar30 = 2;
        }
        else {
          bVar2 = 1;
          bVar30 = 1;
          if (bVar16 != 0 && cVar21 == '\0') {
            bVar30 = 1;
            if (BVar25 == '\0') goto LAB_00133b25;
            goto LAB_00133328;
          }
        }
      }
      else if (bVar11 == 0) {
        if (uVar6 == 0) {
          bVar2 = 1;
          sVar12 = 0;
        }
        else if (bVar16 == 0) {
          bVar2 = 0;
          sVar12 = 0;
        }
        else {
          bVar2 = 0;
          sVar12 = 0;
          if ((BVar4 != '\0') && (sVar12 = 0, chip->eg_ratemax == '\0')) {
            sVar12 = (short)((uint)((int)(short)~uVar6 << (bVar16 & 0x1f)) >> 5);
            bVar2 = 0;
          }
        }
        goto LAB_00133360;
      }
LAB_00133357:
      bVar2 = bVar30;
      sVar12 = 0;
    }
LAB_00133360:
    if (BVar4 == '\0') {
      bVar2 = 3;
    }
  }
  else if (chip->eg_ratemax == '\0') {
    sVar12 = 0;
    bVar2 = 0;
    if ((((bVar11 == 0) && (uVar6 != 0)) && (BVar4 != '\0')) && (sVar12 = 0, bVar16 != 0)) {
      sVar12 = (short)((uint)((int)(short)~uVar6 << (bVar16 & 0x1f)) >> 5);
      bVar2 = 0;
    }
  }
  else {
    uVar6 = 0;
    bVar2 = 0;
    sVar12 = 0;
  }
  if (chip->eg_kon_csm[uVar24] != '\0') {
    uVar6 = uVar6 | (ushort)chip->eg_tl[1] << 3;
  }
  if (((bVar34) && (chip->eg_ssg_hold_up_latch[uVar24] == '\0')) && (bVar11 != 0 && cVar21 != '\0'))
  {
    bVar2 = 3;
    uVar6 = 0x3ff;
  }
  chip->eg_kon[uVar24] = BVar4;
  chip->eg_level[uVar24] = uVar6 + sVar12 & 0x3ff;
  chip->eg_state[uVar24] = bVar2;
  uVar24 = (ulong)(uVar17 + 0x17) % 0x18;
  uVar18 = 0x200 - chip->eg_level[uVar24];
  if (chip->eg_ssg_inv[uVar24] == '\0') {
    uVar18 = chip->eg_level[uVar24];
  }
  uVar18 = uVar18 & 0x3ff;
  if (chip->mode_test_21[5] != '\0') {
    uVar18 = 0;
  }
  uVar18 = chip->eg_lfo_am + uVar18;
  if ((uVar22 != 3) || (chip->mode_csm == '\0')) {
    uVar18 = uVar18 + (ushort)chip->eg_tl[0] * 8;
  }
  uVar6 = 0x3ff;
  if (uVar18 < 0x3ff) {
    uVar6 = uVar18;
  }
  chip->eg_out[uVar24] = uVar6;
  chip->eg_ssg_pgrst_latch[uVar26] = '\0';
  chip->eg_ssg_repeat_latch[uVar26] = '\0';
  chip->eg_ssg_hold_up_latch[uVar26] = '\0';
  bVar11 = chip->ssg_eg[uVar26];
  if ((bVar11 & 8) == 0) {
    bVar30 = chip->eg_kon[uVar26];
    bVar2 = 1;
    bVar16 = 0;
  }
  else {
    bVar16 = chip->eg_ssg_dir[uVar26];
    bVar2 = 1;
    if ((*(byte *)((long)chip->eg_level + uVar26 * 2 + 1) & 2) != 0) {
      if ((bVar11 & 3) == 0) {
        chip->eg_ssg_pgrst_latch[uVar26] = '\x01';
      }
      if ((bVar11 & 1) == 0) {
        chip->eg_ssg_repeat_latch[uVar26] = '\x01';
      }
      bVar16 = bVar16 ^ (bVar11 & 3) == 2;
      bVar2 = bVar11;
      if ((bVar11 & 3) == 3) {
        bVar16 = 1;
      }
    }
    if ((chip->eg_kon_latch[uVar26] != '\0') && (((bVar11 & 7) == 5 || ((bVar11 & 7) == 3)))) {
      chip->eg_ssg_hold_up_latch[uVar26] = '\x01';
    }
    bVar30 = chip->eg_kon[uVar26];
    bVar16 = bVar16 & bVar30;
  }
  chip->eg_ssg_dir[uVar26] = bVar16;
  bVar27 = bVar11 >> 3 & 1;
  chip->eg_ssg_enable[uVar26] = bVar27;
  chip->eg_ssg_inv[uVar26] = (bVar11 >> 2 & bVar27 ^ bVar16) & bVar30;
  bVar16 = chip->eg_rate * '\x02' + chip->eg_ksv;
  bVar11 = 0x3f;
  if (bVar16 < 0x3f) {
    bVar11 = bVar16;
  }
  if ((chip->eg_rate == '\0') || (chip->eg_quotient != 2)) {
    bVar16 = 0;
  }
  else if (bVar16 < 0x30) {
    bVar16 = (bVar11 >> 2) + chip->eg_shift_lock & 0xf;
    if (bVar16 == 0xe) {
      bVar16 = bVar11 & 1;
    }
    else if (bVar16 == 0xd) {
      bVar16 = bVar11 >> 1 & 1;
    }
    else if (bVar16 == 0xc) {
      bVar16 = 1;
    }
    else {
      bVar16 = 0;
    }
  }
  else {
    bVar27 = ((bVar11 >> 2) +
             (char)*(undefined4 *)
                    ((long)eg_stephi[0] +
                    (ulong)chip->eg_timer_low_lock * 4 + (ulong)((bVar11 & 3) << 4))) - 0xb;
    bVar16 = 4;
    if (bVar27 < 4) {
      bVar16 = bVar27;
    }
  }
  chip->eg_inc = bVar16;
  chip->eg_ratemax = (~bVar11 & 0x3e) == 0;
  if (bVar30 == 0) {
    if (chip->eg_kon_latch[uVar26] == '\0') goto code_r0x001335dd;
switchD_001335ed_caseD_0:
    BVar4 = chip->ar[uVar26];
    goto LAB_001335f7;
  }
  if ((bVar2 & 1) == 0) goto switchD_001335ed_caseD_0;
code_r0x001335dd:
  switch(chip->eg_state[uVar26]) {
  case '\0':
    goto switchD_001335ed_caseD_0;
  case '\x01':
    BVar4 = chip->dr[uVar26];
    break;
  case '\x02':
    BVar4 = chip->sr[uVar26];
    break;
  case '\x03':
    BVar4 = chip->rr[uVar26] * '\x02' + '\x01';
    break;
  default:
    goto switchD_001335ed_default;
  }
LAB_001335f7:
  chip->eg_rate = BVar4;
switchD_001335ed_default:
  chip->eg_ksv = chip->pg_kcode >> ((chip->ks[uVar26] ^ 3) & 0x1f);
  if (chip->am[uVar26] == '\0') {
    bVar11 = 0;
  }
  else {
    bVar11 = chip->lfo_am >> ("\a\x03\x01"[chip->ams[uVar32]] & 0x1f);
  }
  chip->eg_lfo_am = bVar11;
  BVar4 = chip->eg_sl[0];
  chip->eg_tl[1] = chip->eg_tl[0];
  chip->eg_tl[0] = chip->tl[uVar26];
  chip->eg_sl[1] = BVar4;
  chip->eg_sl[0] = chip->sl[uVar26];
  if (chip->mode_ch3 == '\0') {
LAB_001336bc:
    uVar26 = (ulong)(uVar22 + 1) % 6;
    chip->pg_fnum = chip->fnum[uVar26];
    pBVar10 = chip->kcode + uVar26;
    chip->pg_block = chip->block[uVar26];
  }
  else {
    uVar7 = uVar17 - 1 >> 1 | (uint)((uVar17 - 1 & 1) != 0) << 0x1f;
    if (uVar7 == 6) {
      chip->pg_fnum = chip->fnum_3ch[2];
      chip->pg_block = chip->block_3ch[2];
      pBVar10 = chip->kcode_3ch + 2;
    }
    else if (uVar7 == 3) {
      chip->pg_fnum = chip->fnum_3ch[0];
      chip->pg_block = chip->block_3ch[0];
      pBVar10 = chip->kcode_3ch;
    }
    else {
      if (uVar7 != 0) goto LAB_001336bc;
      chip->pg_fnum = chip->fnum_3ch[1];
      chip->pg_block = chip->block_3ch[1];
      pBVar10 = chip->kcode_3ch + 1;
    }
  }
  chip->pg_kcode = *pBVar10;
  if ((lfo_samples_per_step[chip->lfo_freq] & ~(uint)chip->lfo_quotient) == 0) {
    bVar3 = chip->lfo_cnt + 1;
    BVar4 = '\0';
  }
  else {
    BVar4 = bVar3 + chip->lfo_quotient;
    bVar3 = chip->lfo_cnt;
  }
  chip->lfo_quotient = BVar4;
  chip->lfo_cnt = bVar3 & chip->lfo_en;
  uVar26 = (ulong)uVar17 % 0xc;
  BVar4 = chip->write_fm_data;
  if (BVar4 != '\0') {
    uVar18 = chip->address;
    if (op_offset[uVar26] == (uVar18 & 0x107)) {
      uVar24 = (ulong)((int)uVar26 + 0xc);
      if ((uVar18 & 8) == 0) {
        uVar24 = uVar26;
      }
      switch((uVar18 & 0xf0) - 0x30 >> 4) {
      case 0:
        bVar3 = chip->data;
        bVar11 = bVar3 & 0xf;
        BVar25 = bVar11 * '\x02';
        if (bVar11 == 0) {
          BVar25 = '\x01';
        }
        chip->multi[uVar24] = BVar25;
        chip->dt[uVar24] = bVar3 >> 4 & 7;
        break;
      case 1:
        chip->tl[uVar24] = chip->data & 0x7f;
        break;
      case 2:
        bVar3 = chip->data;
        chip->ar[uVar24] = bVar3 & 0x1f;
        chip->ks[uVar24] = bVar3 >> 6;
        break;
      case 3:
        bVar3 = chip->data;
        chip->dr[uVar24] = bVar3 & 0x1f;
        chip->am[uVar24] = bVar3 >> 7;
        break;
      case 4:
        chip->sr[uVar24] = chip->data & 0x1f;
        break;
      case 5:
        bVar3 = chip->data;
        chip->rr[uVar24] = bVar3 & 0xf;
        bVar3 = bVar3 >> 4;
        chip->sl[uVar24] = bVar3 + 1 & 0x10 | bVar3;
        break;
      case 6:
        chip->ssg_eg[uVar24] = chip->data & 0xf;
      }
    }
    if (ch_offset[uVar32] == (uVar18 & 0x103)) {
      switch((uVar18 & 0xfc) - 0xa0 >> 2) {
      case 0:
        bVar3 = chip->reg_a4;
        chip->fnum[uVar32] = (bVar3 & 7) << 8 | (ushort)chip->data;
        bVar3 = bVar3 >> 3 & 7;
        chip->block[uVar32] = bVar3;
        chip->kcode[uVar32] = bVar3 << 2 | (byte)fn_note[chip->fnum[uVar32] >> 7];
        break;
      case 1:
        chip->reg_a4 = chip->data;
        break;
      case 2:
        bVar3 = chip->reg_ac;
        chip->fnum_3ch[uVar32] = (bVar3 & 7) << 8 | (ushort)chip->data;
        bVar3 = bVar3 >> 3 & 7;
        chip->block_3ch[uVar32] = bVar3;
        chip->kcode_3ch[uVar32] = bVar3 << 2 | (byte)fn_note[chip->fnum_3ch[uVar32] >> 7];
        break;
      case 3:
        chip->reg_ac = chip->data;
        break;
      case 4:
        bVar3 = chip->data;
        chip->connect[uVar32] = bVar3 & 7;
        chip->fb[uVar32] = bVar3 >> 3 & 7;
        break;
      case 5:
        bVar3 = chip->data;
        chip->pms[uVar32] = bVar3 & 7;
        chip->ams[uVar32] = bVar3 >> 4 & 3;
        chip->pan_l[uVar32] = bVar3 >> 7;
        chip->pan_r[uVar32] = bVar3 >> 6 & 1;
      }
    }
  }
  if (bVar15 == 1) {
    BVar4 = chip->write_fm_address != '\0' && bVar20 == 1;
    chip->write_fm_data = BVar4;
    bVar34 = (chip->write_data & 0xf0) != 0;
    if (bVar34) {
      chip->address = chip->write_data;
    }
    chip->write_fm_address = bVar34;
    if (bVar20 == 1) goto LAB_00133ace;
  }
  else {
    if (bVar20 != 1) goto LAB_00133d03;
    if (chip->write_fm_address != '\0') {
      chip->write_fm_data = '\x01';
      BVar4 = '\x01';
    }
LAB_00133ace:
    uVar18 = chip->write_data;
    if (((uVar18 >> 8 & 1) == 0) && (chip->write_fm_mode_a - 0x21 < 0xc)) {
      bVar3 = (byte)uVar18;
      switch((uint)chip->write_fm_mode_a) {
      case 0x21:
        for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
          chip->mode_test_21[lVar9] = (uVar18 >> ((uint)lVar9 & 0x1f) & 1) != 0;
        }
        break;
      case 0x22:
        bVar11 = 0x7f;
        if ((uVar18 & 8) == 0) {
          bVar11 = bVar3 & 8;
        }
        chip->lfo_en = bVar11;
        chip->lfo_freq = bVar3 & 7;
        break;
      case 0x24:
        chip->timer_a_reg = (chip->timer_a_reg & 3) + (uVar18 & 0xff) * 4;
        break;
      case 0x25:
        chip->timer_a_reg = uVar18 & 3 | chip->timer_a_reg & 0x3fc;
        break;
      case 0x26:
        chip->timer_b_reg = uVar18 & 0xff;
        break;
      case 0x27:
        chip->mode_ch3 = bVar3 >> 6;
        chip->mode_csm = bVar3 >> 6 == 2;
        chip->timer_a_load = bVar3 & 1;
        chip->timer_a_enable = bVar3 >> 2 & 1;
        chip->timer_a_reset = bVar3 >> 4 & 1;
        chip->timer_b_load = bVar3 >> 1 & 1;
        chip->timer_b_enable = bVar3 >> 3 & 1;
        chip->timer_b_reset = bVar3 >> 5 & 1;
        break;
      case 0x28:
        for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
          chip->mode_kon_operator[lVar9] = (uVar18 >> ((byte)((byte)lVar9 | 4) & 0x1f) & 1) != 0;
        }
        uVar17 = uVar18 & 3;
        if (uVar17 == 3) {
          chip->mode_kon_channel = 0xff;
        }
        else {
          chip->mode_kon_channel = ((byte)((int)((uint)uVar18 << 0x1d) >> 0x1f) & 3) + (char)uVar17;
        }
        break;
      case 0x2a:
        chip->dacdata = (chip->dacdata & 1U) + uVar18 * 2 ^ 0x100;
        break;
      case 0x2b:
        chip->dacen = (Bit8u)(uVar18 >> 7);
        break;
      case 0x2c:
        for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
          chip->mode_test_2c[lVar9] = (uVar18 >> ((uint)lVar9 & 0x1f) & 1) != 0;
        }
        chip->dacdata = (ushort)chip->mode_test_2c[3] | chip->dacdata & 0x1feU;
        if (chip->mode_test_2c[7] == '\0') {
          bVar34 = chip->mode_test_2c[6] != '\0';
        }
        else {
          bVar34 = false;
        }
        chip->eg_custom_timer = bVar34;
      }
    }
    if (bVar15 != 1) goto LAB_00133d03;
  }
  chip->write_fm_mode_a = chip->write_data & 0x1ff;
LAB_00133d03:
  if (BVar4 != '\0') {
    chip->data = (Bit8u)chip->write_data;
  }
  uVar26 = (ulong)(chip->cycles + 1) % 0x18;
  chip->cycles = (Bit32u)uVar26;
  chip->channel = (uint)(byte)((ushort)uVar26 % 6);
  *buffer = (int)(short)local_44;
  buffer[1] = BVar29;
  if (chip->status_time != 0) {
    chip->status_time = chip->status_time - 1;
  }
  return;
}

Assistant:

void NOPN2_Clock(ym3438_t *chip, Bit32s *buffer)
{
    Bit32u slot = chip->cycles;
    chip->lfo_inc = chip->mode_test_21[1];
    chip->pg_read >>= 1;
    chip->eg_read[1] >>= 1;
    chip->eg_cycle++;
    /* Lock envelope generator timer value */
    if (chip->cycles == 1 && chip->eg_quotient == 2)
    {
        if (chip->eg_cycle_stop)
        {
            chip->eg_shift_lock = 0;
        }
        else
        {
            chip->eg_shift_lock = chip->eg_shift + 1;
        }
        chip->eg_timer_low_lock = chip->eg_timer & 0x03;
    }
    /* Cycle specific functions */
    switch (chip->cycles)
    {
    case 0:
        chip->lfo_pm = chip->lfo_cnt >> 2;
        if (chip->lfo_cnt & 0x40)
        {
            chip->lfo_am = chip->lfo_cnt & 0x3f;
        }
        else
        {
            chip->lfo_am = chip->lfo_cnt ^ 0x3f;
        }
        chip->lfo_am <<= 1;
        break;
    case 1:
        chip->eg_quotient++;
        chip->eg_quotient %= 3;
        chip->eg_cycle = 0;
        chip->eg_cycle_stop = 1;
        chip->eg_shift = 0;
        chip->eg_timer_inc |= chip->eg_quotient >> 1;
        chip->eg_timer = chip->eg_timer + chip->eg_timer_inc;
        chip->eg_timer_inc = chip->eg_timer >> 12;
        chip->eg_timer &= 0xfff;
        break;
    case 2:
        chip->pg_read = chip->pg_phase[21] & 0x3ff;
        chip->eg_read[1] = chip->eg_out[0];
        break;
    case 13:
        chip->eg_cycle = 0;
        chip->eg_cycle_stop = 1;
        chip->eg_shift = 0;
        chip->eg_timer = chip->eg_timer + chip->eg_timer_inc;
        chip->eg_timer_inc = chip->eg_timer >> 12;
        chip->eg_timer &= 0xfff;
        break;
    case 23:
        chip->lfo_inc |= 1;
        break;
    }
    chip->eg_timer &= ~(chip->mode_test_21[5] << chip->eg_cycle);
    if (((chip->eg_timer >> chip->eg_cycle) | (chip->pin_test_in & chip->eg_custom_timer)) & chip->eg_cycle_stop)
    {
        chip->eg_shift = chip->eg_cycle;
        chip->eg_cycle_stop = 0;
    }

    NOPN2_DoIO(chip);

    NOPN2_DoTimerA(chip);
    NOPN2_DoTimerB(chip);
    NOPN2_KeyOn(chip);

    NOPN2_ChOutput(chip);
    NOPN2_ChGenerate(chip);

    NOPN2_FMPrepare(chip);
    NOPN2_FMGenerate(chip);

    NOPN2_PhaseGenerate(chip);
    NOPN2_PhaseCalcIncrement(chip);

    NOPN2_EnvelopeADSR(chip);
    NOPN2_EnvelopeGenerate(chip);
    NOPN2_EnvelopeSSGEG(chip);
    NOPN2_EnvelopePrepare(chip);

    /* Prepare fnum & block */
    if (chip->mode_ch3)
    {
        /* Channel 3 special mode */
        switch (slot)
        {
        case 1: /* OP1 */
            chip->pg_fnum = chip->fnum_3ch[1];
            chip->pg_block = chip->block_3ch[1];
            chip->pg_kcode = chip->kcode_3ch[1];
            break;
        case 7: /* OP3 */
            chip->pg_fnum = chip->fnum_3ch[0];
            chip->pg_block = chip->block_3ch[0];
            chip->pg_kcode = chip->kcode_3ch[0];
            break;
        case 13: /* OP2 */
            chip->pg_fnum = chip->fnum_3ch[2];
            chip->pg_block = chip->block_3ch[2];
            chip->pg_kcode = chip->kcode_3ch[2];
            break;
        case 19: /* OP4 */
        default:
            chip->pg_fnum = chip->fnum[(chip->channel + 1) % 6];
            chip->pg_block = chip->block[(chip->channel + 1) % 6];
            chip->pg_kcode = chip->kcode[(chip->channel + 1) % 6];
            break;
        }
    }
    else
    {
        chip->pg_fnum = chip->fnum[(chip->channel + 1) % 6];
        chip->pg_block = chip->block[(chip->channel + 1) % 6];
        chip->pg_kcode = chip->kcode[(chip->channel + 1) % 6];
    }

    NOPN2_UpdateLFO(chip);
    NOPN2_DoRegWrite(chip);
    chip->cycles = (chip->cycles + 1) % 24;
    chip->channel = chip->cycles % 6;

    buffer[0] = chip->mol;
    buffer[1] = chip->mor;

    if (chip->status_time)
        chip->status_time--;
}